

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionOK.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionOK::write_cpp
          (InstructionOK *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  ostream *poVar2;
  StreamSepMaker local_180;
  StreamSep local_f8;
  StreamSep local_b0;
  StreamSep local_68;
  
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    StreamSepMaker::operator<<((StreamSep *)&local_180,ss,(char (*) [27])0x17e02e);
    cpp_emitter->nb_cont_label = cpp_emitter->nb_cont_label + 1;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_180.stream,local_180.first_beg._M_dataplus._M_p,
                        local_180.first_beg._M_string_length);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    StreamSep::operator<<((StreamSep *)&local_180,(char (*) [2])0x17d5c3);
    StreamSep::~StreamSep((StreamSep *)&local_180);
  }
  StreamSepMaker::operator<<(&local_68,ss,(char (*) [15])"return RET_OK;");
  StreamSep::~StreamSep(&local_68);
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    StreamSepMaker::rm_beg(&local_180,es,2);
    StreamSepMaker::operator<<(&local_f8,&local_180,(char (*) [3])0x17e17b);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_f8.stream,local_f8.sep._M_dataplus._M_p,local_f8.sep._M_string_length)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    StreamSep::operator<<(&local_f8,(char (*) [2])0x17d6d7);
    StreamSep::~StreamSep(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.end._M_dataplus._M_p != &local_180.end.field_2) {
      operator_delete(local_180.end._M_dataplus._M_p,local_180.end.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sep._M_dataplus._M_p != &local_180.sep.field_2) {
      operator_delete(local_180.sep._M_dataplus._M_p,local_180.sep.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.beg._M_dataplus._M_p != &local_180.beg.field_2) {
      operator_delete(local_180.beg._M_dataplus._M_p,local_180.beg.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.first_beg._M_dataplus._M_p != &local_180.first_beg.field_2) {
      operator_delete(local_180.first_beg._M_dataplus._M_p,
                      local_180.first_beg.field_2._M_allocated_capacity + 1);
    }
    StreamSepMaker::operator<<(&local_b0,es,(char (*) [21])"return RET_ENDED_OK;");
    StreamSep::~StreamSep(&local_b0);
  }
  return;
}

Assistant:

void InstructionOK::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->interruptible() )
        ss << "HPIPE_DATA.inp_cont = &&c_" << ++cpp_emitter->nb_cont_label << ";";

    ss << "return RET_OK;";

    if ( cpp_emitter->interruptible() ) {
        es.rm_beg( 2 ) << "c_" << cpp_emitter->nb_cont_label << ":";
        es << "return RET_ENDED_OK;";
    }
}